

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

iterator *
cs_impl::array_cs_ext::insert(iterator *__return_storage_ptr__,array *arr,iterator *pos,var *val)

{
  any aStack_68;
  any local_60;
  _Elt_pointer local_58;
  _Map_pointer ppaStack_50;
  _Elt_pointer local_48;
  _Elt_pointer paStack_40;
  const_iterator local_38;
  
  local_48 = pos->_M_cur;
  paStack_40 = pos->_M_first;
  local_58 = pos->_M_last;
  ppaStack_50 = pos->_M_node;
  local_60.mDat = val->mDat;
  if (local_60.mDat != (proxy *)0x0) {
    (local_60.mDat)->refcount = (local_60.mDat)->refcount + 1;
  }
  cs::copy((EVP_PKEY_CTX *)&aStack_68,(EVP_PKEY_CTX *)&local_60);
  local_38._M_cur = local_48;
  local_38._M_first = paStack_40;
  local_38._M_last = local_58;
  local_38._M_node = ppaStack_50;
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace<cs_impl::any>
            (__return_storage_ptr__,arr,&local_38,&aStack_68);
  any::recycle(&aStack_68);
  any::recycle(&local_60);
  return __return_storage_ptr__;
}

Assistant:

array::iterator insert(array &arr, array::iterator &pos, const var &val)
		{
			return arr.insert(pos, copy(val));
		}